

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O2

Am_Wrapper * __thiscall Am_Gesture_Trainer_Data::Make_Unique(Am_Gesture_Trainer_Data *this)

{
  Am_Gesture_Trainer_Data *this_00;
  
  this_00 = this;
  if ((this->super_Am_Wrapper).refs != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_00 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data(this_00,this);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data()
{
  head = tail = nullptr;
  nclasses = 0;
  cached_classifier = nullptr;
}